

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O1

uint32 __thiscall Js::WebAssemblyModule::GetModuleEnvironmentSize(WebAssemblyModule *this)

{
  uint offset;
  uint32 uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (((this->m_functionsInfo).ptr)->
          super_ReadOnlyList<Wasm::WasmFunctionInfo_*,_Memory::Recycler,_DefaultComparer>).count;
  if ((uVar2 < 0xfffffffd) &&
     (uVar2 = uVar2 + 3, uVar3 = uVar2 + this->m_importedFunctionCount,
     !CARRY4(uVar2,this->m_importedFunctionCount))) {
    offset = GetGlobalsByteSize(this);
    uVar1 = WAsmJs::ConvertOffset(offset,1,8);
    if (!CARRY4(uVar1,uVar3)) {
      return uVar1 + uVar3;
    }
  }
  ::Math::DefaultOverflowPolicy();
}

Assistant:

uint32
WebAssemblyModule::GetModuleEnvironmentSize() const
{
    static const uint DOUBLE_SIZE_IN_INTS = sizeof(double) / sizeof(int);
    // 1 each for memory, table, and signatures
    uint32 size = 3;
    size = UInt32Math::Add(size, GetWasmFunctionCount());
    size = UInt32Math::Add(size, GetImportedFunctionCount());
    size = UInt32Math::Add(size, WAsmJs::ConvertOffset<byte, Js::Var>(GetGlobalsByteSize()));
    return size;
}